

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  int __errnum;
  protobuf *this_00;
  _Base_ptr size;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ssize_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  int error;
  uint uVar11;
  uint uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  long lVar13;
  void *__buf;
  ulong uVar14;
  StringPiece full;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_40;
  _Base_ptr local_38;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar4 = access((prefix->_M_dataplus)._M_p,0), iVar4 != -1)) {
      local_60 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_38 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_40 = prefix;
      if (local_60 == local_38) {
        return true;
      }
      do {
        __buf = *(void **)(local_60 + 2);
        uVar11 = *(uint *)&local_60[2]._M_parent;
        this_00 = *(protobuf **)(local_60 + 1);
        size = local_60[1]._M_parent;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)size,"string length exceeds max size");
        }
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        full.length_ = (size_type)"/\\";
        full.ptr_ = (char *)size;
        SplitStringUsing(this_00,full,(char *)&local_58,in_R8);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        pcVar1 = (local_40->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar1,pcVar1 + local_40->_M_string_length);
        bVar3 = true;
        if ((long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20) {
          lVar13 = 8;
          uVar14 = 0;
          do {
            std::__cxx11::string::_M_append
                      ((char *)&local_80,
                       *(ulong *)((long)local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8));
            iVar4 = mkdir(local_80._M_dataplus._M_p,0x1ff);
            if ((iVar4 != 0) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,*(char **)(local_60 + 1),
                                  (long)local_60[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,": while trying to create directory ",0x23);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_80._M_dataplus._M_p,local_80._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              pcVar9 = strerror(*piVar6);
              if (pcVar9 == (char *)0x0) {
                std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
              }
              else {
                sVar10 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              bVar3 = false;
              break;
            }
            std::__cxx11::string::push_back((char)&local_80);
            uVar14 = uVar14 + 1;
            lVar13 = lVar13 + 0x20;
          } while (uVar14 < ((long)local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        if (!bVar3) {
          return false;
        }
        std::operator+(&local_80,local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_60 + 1));
        while (iVar4 = open(local_80._M_dataplus._M_p,0x241,0x1b6), iVar4 < 0) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          if (iVar4 != 4) {
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_80._M_dataplus._M_p,
                                local_80._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            pcVar9 = strerror(iVar4);
            std::operator<<(poVar8,pcVar9);
            goto LAB_0022c5a8;
          }
        }
        if (0 < (int)uVar11) {
          do {
            while( true ) {
              sVar7 = write(iVar4,__buf,(ulong)uVar11);
              uVar5 = (uint)sVar7;
              if (-1 < (int)uVar5) break;
              piVar6 = __errno_location();
              __errnum = *piVar6;
              if (__errnum != 4) {
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_80._M_dataplus._M_p,
                                    local_80._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,": write: ",9);
                pcVar9 = strerror(__errnum);
                if (pcVar9 == (char *)0x0) {
                  std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
                }
                else {
                  sVar10 = strlen(pcVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
                }
                goto LAB_0022c5a8;
              }
            }
            if (uVar5 == 0) {
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_80._M_dataplus._M_p,
                                  local_80._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,": write() returned zero?",0x18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_0022c5a8;
            }
            __buf = (void *)((long)__buf + (ulong)(uVar5 & 0x7fffffff));
            uVar12 = uVar11 - uVar5;
            bVar2 = (int)uVar5 <= (int)uVar11;
            uVar11 = uVar12;
          } while (uVar12 != 0 && bVar2);
        }
        iVar4 = close(iVar4);
        if (iVar4 != 0) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_80._M_dataplus._M_p,
                              local_80._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": close: ",9);
          pcVar9 = strerror(iVar4);
          std::operator<<(poVar8,pcVar9);
LAB_0022c5a8:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p == &local_80.field_2) {
            return false;
          }
          operator_delete(local_80._M_dataplus._M_p);
          return false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        local_60 = (_Base_ptr)std::_Rb_tree_increment(local_60);
        if (local_60 == local_38) {
          return bVar3;
        }
      } while( true );
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
    piVar6 = __errno_location();
    pcVar9 = strerror(*piVar6);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}